

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

void QUtil::read_lines_from_file
               (function<bool_(char_&)> *next_char,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines,bool preserve_eol)

{
  _List_node_base *p_Var1;
  bool bVar2;
  undefined4 in_EAX;
  undefined7 in_register_00000011;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  char c;
  undefined8 uStack_38;
  undefined4 uStack_34;
  
  uStack_38 = CONCAT44((int)CONCAT71(in_register_00000011,preserve_eol),in_EAX);
  p_Var3 = (_List_node_base *)0x0;
  while( true ) {
    bVar2 = std::function<bool_(char_&)>::operator()(next_char,&c);
    if (!bVar2) break;
    p_Var4 = p_Var3;
    if (p_Var3 == (_List_node_base *)0x0) {
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[1]>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                 (char (*) [1])0x229dd6);
      p_Var4 = (lines->
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_prev + 1;
      std::__cxx11::string::reserve((ulong)p_Var4);
    }
    p_Var3 = (_List_node_base *)0xf;
    if (p_Var4->_M_next != p_Var4 + 1) {
      p_Var3 = p_Var4[1]._M_next;
    }
    if (p_Var3 == p_Var4->_M_prev) {
      std::__cxx11::string::reserve((ulong)p_Var4);
    }
    if (c == '\n') {
      if ((char)uStack_34 == '\0') {
        p_Var1 = p_Var4->_M_prev;
        p_Var3 = (_List_node_base *)0x0;
        if ((p_Var1 != (_List_node_base *)0x0) &&
           (p_Var3 = (_List_node_base *)0x0,
           ((undefined1 *)((long)&p_Var4->_M_next[-1]._M_prev + 7))[(long)p_Var1] == '\r')) {
          std::__cxx11::string::erase((ulong)p_Var4,(ulong)((long)&p_Var1[-1]._M_prev + 7));
          p_Var3 = (_List_node_base *)0x0;
        }
      }
      else {
        std::__cxx11::string::append((ulong)p_Var4,'\x01');
        p_Var3 = (_List_node_base *)0x0;
      }
    }
    else {
      std::__cxx11::string::append((ulong)p_Var4,'\x01');
      p_Var3 = p_Var4;
    }
  }
  return;
}

Assistant:

void
QUtil::read_lines_from_file(
    std::function<bool(char&)> next_char, std::list<std::string>& lines, bool preserve_eol)
{
    std::string* buf = nullptr;
    char c;
    while (next_char(c)) {
        if (buf == nullptr) {
            lines.emplace_back("");
            buf = &(lines.back());
            buf->reserve(80);
        }

        if (buf->capacity() == buf->size()) {
            buf->reserve(buf->capacity() * 2);
        }
        if (c == '\n') {
            if (preserve_eol) {
                buf->append(1, c);
            } else {
                // Remove any carriage return that preceded the newline and discard the newline
                if ((!buf->empty()) && ((*(buf->rbegin())) == '\r')) {
                    buf->erase(buf->length() - 1);
                }
            }
            buf = nullptr;
        } else {
            buf->append(1, c);
        }
    }
}